

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

bool __thiscall gl3cts::TransformFeedback::APIErrors::testExtension2(APIErrors *this)

{
  ostringstream *this_00;
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar4;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x3cb);
  (**(code **)(lVar4 + 0xfe0))();
  iVar2 = (**(code **)(lVar4 + 0x800))();
  if (iVar2 == 0x502) {
    (**(code **)(lVar4 + 0x1248))();
    iVar2 = (**(code **)(lVar4 + 0x800))();
    if (iVar2 == 0x502) {
      (**(code **)(lVar4 + 0x1680))(this->m_program_id_with_output);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x3ee);
      (**(code **)(lVar4 + 0x48))(0x8c8e,0,this->m_buffer_0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBindBufferBase call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x3f2);
      (**(code **)(lVar4 + 0x5b0))(0,this->m_transform_feedback_object_0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 == 0x502) {
        (**(code **)(lVar4 + 0x30))(0);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glBeginTransformFeedback call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                        ,0x405);
        (**(code **)(lVar4 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
        iVar2 = (**(code **)(lVar4 + 0x800))();
        if (iVar2 == 0x502) {
          (**(code **)(lVar4 + 0x488))(1,&this->m_transform_feedback_object_0);
          iVar2 = (**(code **)(lVar4 + 0x800))();
          if (iVar2 == 0x502) {
            (**(code **)(lVar4 + 0x1248))();
            iVar2 = (**(code **)(lVar4 + 0x800))();
            if (iVar2 == 0x502) {
              (**(code **)(lVar4 + 0xfe0))();
              dVar3 = (**(code **)(lVar4 + 0x800))();
              glu::checkError(dVar3,"glPauseTransformFeedback call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                              ,0x43e);
              (**(code **)(lVar4 + 0x538))(1,0,2);
              iVar2 = (**(code **)(lVar4 + 0x800))();
              if (iVar2 == 0) {
                (**(code **)(lVar4 + 0xce8))(this->m_program_id_with_output);
                iVar2 = (**(code **)(lVar4 + 0x800))();
                if (iVar2 != 0x502) {
                  local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
                  this_00 = (ostringstream *)(local_1a0 + 8);
                  std::__cxx11::ostringstream::ostringstream(this_00);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,
                             "INVALID_OPERATION was not generated by LinkProgram when <program> was used by some transform feedback object that is currently not active."
                             ,0x8a);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1a0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(this_00);
                  std::ios_base::~ios_base(local_128);
                  (**(code **)(lVar4 + 0x638))();
                  return false;
                }
                (**(code **)(lVar4 + 0x1680))(0);
                iVar2 = (**(code **)(lVar4 + 0x800))();
                if (iVar2 == 0) {
                  (**(code **)(lVar4 + 0x1680))(this->m_program_id_with_output);
                  dVar3 = (**(code **)(lVar4 + 0x800))();
                  glu::checkError(dVar3,"glUseProgram call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                  ,0x473);
                  (**(code **)(lVar4 + 0x638))();
                  dVar3 = (**(code **)(lVar4 + 0x800))();
                  glu::checkError(dVar3,"glEndTransformFeedback call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                                  ,0x478);
                  iVar2 = 1;
                  while (cVar1 = (**(code **)(lVar4 + 0xcd0))(iVar2), cVar1 != '\0') {
                    iVar2 = iVar2 + 1;
                    if (iVar2 == 0xffff) {
                      local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_1a0 + 8),
                                 "Cannot find unused trnasform feedback object.",0x2d);
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1a0,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
                      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a0);
                      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
                      *puVar5 = 0;
                      __cxa_throw(puVar5,&int::typeinfo,0);
                    }
                  }
                  (**(code **)(lVar4 + 0x5b0))(0,iVar2);
                  iVar2 = (**(code **)(lVar4 + 0x800))();
                  if (iVar2 == 0x501) {
                    return true;
                  }
                  (**(code **)(lVar4 + 0x638))();
                  local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_1a0 + 8),
                             "glUseProgram unexpectedly failed when transform feedback is paused.",
                             0x43);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1a0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                }
                else {
                  (**(code **)(lVar4 + 0x638))();
                  local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_1a0 + 8),
                             "glUseProgram unexpectedly failed when transform feedback is paused.",
                             0x43);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1a0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                }
              }
              else {
                (**(code **)(lVar4 + 0x638))();
                local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1a0 + 8),
                           "No error is not generated by draw command when transform feedback is paused and primitive modes do not match."
                           ,0x6d);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
              }
            }
            else {
              (**(code **)(lVar4 + 0x638))();
              local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1a0 + 8),
                         "INVALID_OPERATION is not generated by ResumeTransformFeedback if current transform feedback is not not paused."
                         ,0x6e);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            }
          }
          else {
            (**(code **)(lVar4 + 0x638))();
            local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1a0 + 8),
                       "INVALID_OPERATION is not generated by DeleteTransformFeedbacks if any of <ids> is active."
                       ,0x59);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        else {
          (**(code **)(lVar4 + 0x638))();
          local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1a0 + 8),
                     "INVALID_OPERATION is not generated by BindTransformFeedback if current transform feedback is active and not paused."
                     ,0x73);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1a0 + 8),
                   "INVALID_OPERATION is not generated by DrawTransformFeedback when EndTransformFeedback was never called for the object named <id>."
                   ,0x81);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0 + 8),
                 "INVALID_OPERATION is not generated by ResumeTransformFeedback if current transform feedback is not active."
                 ,0x6a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 8),
               "INVALID_OPERATION is not generated by PauseTransformFeedback if current transform feedback is not active or paused."
               ,0x73);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 8));
  std::ios_base::~ios_base(local_128);
  return false;
}

Assistant:

bool gl3cts::TransformFeedback::APIErrors::testExtension2(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  Bind Transform Feedback Object */
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	/*  INVALID_OPERATION is generated by PauseTransformFeedback if current
	 transform feedback is not active or paused; */

	gl.pauseTransformFeedback();

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by PauseTransformFeedback if "
											   "current transform feedback is not active or paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by ResumeTransformFeedback if current
	 transform feedback is not active; */

	gl.resumeTransformFeedback();

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by ResumeTransformFeedback if "
											   "current transform feedback is not active."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  Prepare program and buffer. */
	gl.useProgram(m_program_id_with_output);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase call failed.");

	/*  INVALID_OPERATION is generated by DrawTransformFeedback when
	 EndTransformFeedback was never called for the object named <id>. */
	gl.drawTransformFeedback(GL_POINTS, m_transform_feedback_object_0);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by DrawTransformFeedback when "
											   "EndTransformFeedback was never called for the object named <id>."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  Make Transform Feedback Active */
	gl.beginTransformFeedback(GL_POINTS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	/*  INVALID_OPERATION is generated by BindTransformFeedback if current
	 transform feedback is active and not paused; */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by BindTransformFeedback if current "
											   "transform feedback is active and not paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by DeleteTransformFeedbacks if any of <ids>
	 is active; */

	gl.deleteTransformFeedbacks(1, &m_transform_feedback_object_0);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "INVALID_OPERATION is not generated by DeleteTransformFeedbacks if any of <ids> is active."
			<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by ResumeTransformFeedback if current
	 transform feedback is not not paused; */

	gl.resumeTransformFeedback();

	if (GL_INVALID_OPERATION != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION is not generated by ResumeTransformFeedback if "
											   "current transform feedback is not not paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  pause transform feedback */

	gl.pauseTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback call failed.");

	/*  No error is generated by draw command when transform feedback is paused
	 and primitive modes do not match; */

	gl.drawArrays(GL_LINES, 0, 2);

	if (GL_NO_ERROR != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "No error is not generated by draw command when transform feedback is "
											   "paused and primitive modes do not match."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	/*  INVALID_OPERATION is generated by LinkProgram when <program> is used by
	 some transform feedback object that is currently not active; */

	gl.linkProgram(m_program_id_with_output);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_OPERATION was not generated by LinkProgram when <program> was "
											   "used by some transform feedback object that is currently not active."
											<< tcu::TestLog::EndMessage;

		gl.endTransformFeedback();

		return false;
	}

	/*  No error is generated by UseProgram when transform feedback is paused; */

	gl.useProgram(0);

	if (GL_NO_ERROR != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glUseProgram unexpectedly failed when transform feedback is paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	gl.useProgram(m_program_id_with_output);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	/*  End Transform Feedback and make draw. */

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/*  INVALID_VALUE is generated by DrawTransformFeedback if <id> is not name of
	 transform feedback object; */

	unsigned short int invalid_name = 1;

	while (gl.isTransformFeedback(invalid_name))
	{
		++invalid_name;

		/* Make sure that this loop ends someday, bad day. */
		if (invalid_name == USHRT_MAX)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Cannot find unused trnasform feedback object." << tcu::TestLog::EndMessage;
			throw 0;
		}
	}

	gl.drawTransformFeedback(GL_POINTS, (glw::GLuint)invalid_name);

	if (GL_INVALID_VALUE != gl.getError())
	{
		gl.endTransformFeedback();

		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glUseProgram unexpectedly failed when transform feedback is paused."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}